

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::tydra::anon_unknown_6::GetPrimProperty<tinyusdz::BlendShape>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,BlendShape *blendshape,string *prop_name,Property *out_prop)

{
  size_type *psVar1;
  fmt fVar2;
  bool bVar3;
  int iVar4;
  const_iterator cVar5;
  vector<int,_std::allocator<int>_> *this;
  _Base_ptr args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  optional<std::vector<int,_std::allocator<int>_>_> pv;
  string err;
  Value val;
  Attribute attr;
  PrimVar pvar;
  undefined1 local_938 [16];
  undefined1 local_928 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8f8;
  undefined1 local_8e8 [16];
  string local_8d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8a8;
  undefined1 local_898 [16];
  _Alloc_hider local_888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_880;
  storage_union local_870;
  undefined **local_860;
  undefined1 local_858;
  undefined1 local_850 [32];
  undefined1 local_830 [24];
  AttrMetas AStack_818;
  storage_union local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  undefined1 local_5f0 [8];
  string sStack_5e8;
  undefined7 uStack_5e7;
  undefined1 uStack_5e0;
  undefined8 uStack_5df;
  any local_5c8;
  bool local_5b0;
  pointer local_5a8;
  pointer local_5a0;
  pointer local_598;
  bool local_590;
  pointer local_588;
  pointer local_580;
  pointer local_578;
  AttrMetas AStack_570;
  ListEditQual local_368;
  Type TStack_364;
  Type local_360;
  Path PStack_358;
  pointer local_288;
  pointer local_280;
  pointer local_278;
  ListEditQual local_270;
  AttrMetas AStack_268;
  bool local_60;
  string asStack_58 [32];
  bool local_38;
  
  if (out_prop == (Property *)0x0) {
    local_610.dynamic = "[InternalError] nullptr in output Property is not allowed.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_610);
    return __return_storage_ptr__;
  }
  local_928._16_8_ = local_928 + 0x20;
  local_928._24_8_ = 0;
  local_928[0x20] = 0;
  iVar4 = ::std::__cxx11::string::compare((char *)prop_name);
  if (iVar4 == 0) {
    bVar3 = (anonymous_namespace)::
            ToProperty<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                      (&blendshape->offsets,out_prop,(string *)(local_928 + 0x10));
    if (bVar3) goto LAB_004f31e0;
    local_938._0_8_ = local_928;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_938,"Convert Property {} failed: {}\n","");
    fmt::format<char[8],std::__cxx11::string>
              ((string *)&local_8b8,(fmt *)local_938,(string *)0x61f317,
               (char (*) [8])(local_928 + 0x10),in_R8);
LAB_004f2a04:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8b8._M_allocated_capacity == &local_8a8) {
      local_600._8_8_ = local_8a8._8_8_;
      local_610.dynamic = &local_600;
    }
    else {
      local_610.dynamic = (void *)local_8b8._M_allocated_capacity;
    }
    local_600._M_allocated_capacity._1_7_ = local_8a8._M_allocated_capacity._1_7_;
    local_600._M_local_buf[0] = local_8a8._M_local_buf[0];
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    psVar1 = (size_type *)
             ((long)&(__return_storage_ptr__->contained).
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0 + 0x10);
    *(size_type **)
     &(__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0 = psVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610.dynamic == &local_600) {
      *psVar1 = local_600._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x18) = local_600._8_8_;
    }
    else {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_dataplus._M_p = (pointer)local_610.dynamic;
      *(size_type *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x10) = local_600._M_allocated_capacity;
    }
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_string_length = local_8b8._8_8_;
LAB_004f2dc5:
    local_600._M_allocated_capacity = (ulong)(uint7)local_8a8._M_allocated_capacity._1_7_ << 8;
    local_610._8_8_ = 0;
    local_610.dynamic = &local_600;
    local_8a8._M_local_buf[0] = '\0';
    local_8b8._8_8_ = 0;
    local_8b8._M_allocated_capacity = (size_type)&local_8a8;
    if ((pointer)local_938._0_8_ != (pointer)local_928) {
      operator_delete((void *)local_938._0_8_,(ulong)(local_928._0_8_ + 1));
    }
  }
  else {
    iVar4 = ::std::__cxx11::string::compare((char *)prop_name);
    if (iVar4 == 0) {
      bVar3 = (anonymous_namespace)::
              ToProperty<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                        (&blendshape->normalOffsets,out_prop,(string *)(local_928 + 0x10));
      if (!bVar3) {
        local_938._0_8_ = local_928;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_938,"Convert Property {} failed: {}\n","");
        fmt::format<char[14],std::__cxx11::string>
                  ((string *)&local_8b8,(fmt *)local_938,(string *)"normalOffsets",
                   (char (*) [14])(local_928 + 0x10),in_R8);
        goto LAB_004f2a04;
      }
    }
    else {
      iVar4 = ::std::__cxx11::string::compare((char *)prop_name);
      if (iVar4 == 0) {
        local_8b8._M_allocated_capacity = (size_type)&local_8a8;
        local_8b8._8_8_ = 0;
        local_8a8._M_local_buf[0] = '\0';
        local_898[4] = '\0';
        local_898._8_8_ = &local_880;
        local_888._M_p = (pointer)0x0;
        local_880._M_local_buf[0] = '\0';
        local_860 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_870.dynamic = (void *)0x0;
        local_858 = 0;
        local_850._0_8_ = (pointer)0x0;
        local_850[8] = 0;
        local_850._9_7_ = 0;
        local_850[0x10] = 0;
        local_850._17_8_ = 0;
        AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
        AStack_818.elementSize.has_value_ = false;
        AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
        AStack_818.hidden.has_value_ = false;
        AStack_818.hidden.contained = (storage_t<bool>)0x0;
        AStack_818.comment.has_value_ = false;
        AStack_818.weight.contained = (storage_t<double>)0x0;
        AStack_818.connectability.has_value_ = false;
        AStack_818.bindMaterialAs.contained._16_8_ = 0;
        AStack_818.bindMaterialAs.contained._24_8_ = 0;
        AStack_818.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
        ;
        AStack_818.bindMaterialAs.contained._8_8_ = 0;
        args = &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
        AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.comment.contained._8_8_ = 0;
        AStack_818.comment.contained._16_8_ = 0;
        AStack_818.comment.contained._24_8_ = 0;
        AStack_818.comment.contained._32_8_ = 0;
        AStack_818.comment.contained._40_8_ = 0;
        AStack_818.customData.has_value_ = false;
        AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.customData.contained._8_8_ = 0;
        AStack_818.customData.contained._16_8_ = 0;
        AStack_818.customData.contained._24_8_ = 0;
        AStack_818.customData.contained._32_8_ = 0;
        AStack_818.customData.contained._40_8_ = 0;
        AStack_818.weight.has_value_ = false;
        AStack_818.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
        ;
        AStack_818.connectability.contained._8_8_ = 0;
        AStack_818.connectability.contained._16_8_ = 0;
        AStack_818.connectability.contained._24_8_ = 0;
        AStack_818.outputName.has_value_ = false;
        AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.outputName.contained._8_8_ = 0;
        AStack_818.outputName.contained._16_8_ = 0;
        AStack_818.outputName.contained._24_8_ = 0;
        AStack_818.renderType.has_value_ = false;
        AStack_818.sdrMetadata.has_value_ = false;
        AStack_818.renderType.contained._16_8_ = 0;
        AStack_818.renderType.contained._24_8_ = 0;
        AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.renderType.contained._8_8_ = 0;
        AStack_818.displayName.has_value_ = false;
        AStack_818.sdrMetadata.contained._32_8_ = 0;
        AStack_818.sdrMetadata.contained._40_8_ = 0;
        AStack_818.sdrMetadata.contained._16_8_ = 0;
        AStack_818.sdrMetadata.contained._24_8_ = 0;
        AStack_818.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.sdrMetadata.contained._8_8_ = 0;
        AStack_818.displayGroup.has_value_ = false;
        AStack_818.displayName.contained._16_8_ = 0;
        AStack_818.displayName.contained._24_8_ = 0;
        AStack_818.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.displayName.contained._8_8_ = 0;
        AStack_818.bindMaterialAs.has_value_ = false;
        AStack_818.displayGroup.contained._16_8_ = 0;
        AStack_818.displayGroup.contained._24_8_ = 0;
        AStack_818.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_818.displayGroup.contained._8_8_ = 0;
        local_830[0x10] = 0;
        stack0xfffffffffffff7e1 = 0;
        local_830._0_8_ = (pointer)0x0;
        local_830[8] = 0;
        local_830._9_7_ = 0;
        AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        AStack_818.stringData.
        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        AStack_818.stringData.
        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        AStack_818.stringData.
        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_898._0_4_ = 1;
        AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left = args;
        AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right = args;
        tinyusdz::value::TypeTraits<std::vector<int,std::allocator<int>>>::type_name_abi_cxx11_();
        ::std::__cxx11::string::_M_assign((string *)(local_898 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_610.dynamic != &local_600) {
          operator_delete(local_610.dynamic,local_600._M_allocated_capacity + 1);
        }
        if ((blendshape->pointIndices)._blocked == true) {
          local_858 = 1;
        }
        if ((blendshape->pointIndices)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (blendshape->pointIndices)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start) {
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(blendshape->pointIndices)._paths);
        }
        if ((blendshape->pointIndices)._attrib.has_value_ == true) {
          local_938[0] = (fmt)0x1;
          ::std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)(local_938 + 8),
                     (vector<int,_std::allocator<int>_> *)
                     &(blendshape->pointIndices)._attrib.contained);
          fVar2 = local_938[0];
          if (local_938[0] == (fmt)0x1) {
            local_8e8._0_8_ =
                 linb::any::vtable_for_type<std::vector<int,std::allocator<int>>>()::table;
            this = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
            ::std::vector<int,_std::allocator<int>_>::vector
                      (this,(vector<int,_std::allocator<int>_> *)(local_938 + 8));
            local_600._M_allocated_capacity =
                 (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_610.dynamic =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_600._8_8_ = local_600._8_8_ & 0xffffffffffffff00;
            local_5f0 = (undefined1  [8])0x0;
            sStack_5e8 = (string)0x0;
            uStack_5e7 = 0;
            uStack_5e0 = 0;
            uStack_5df = 0;
            local_8f8._M_allocated_capacity = (size_type)this;
            linb::any::operator=((any *)&local_610,(any *)(local_928 + 0x30));
            Attribute::set_var((Attribute *)&local_8b8,(PrimVar *)&local_610);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)local_5f0);
            if ((undefined **)local_600._M_allocated_capacity != (undefined **)0x0) {
              (**(code **)(local_600._M_allocated_capacity + 0x20))(&local_610);
              local_600._M_allocated_capacity = 0;
            }
            if ((pointer)local_8e8._0_8_ != (pointer)0x0) {
              (**(code **)(local_8e8._0_8_ + 0x20))((storage_union *)(local_928 + 0x30));
              local_8e8._0_8_ = (pointer)0x0;
            }
          }
          else {
            local_8f8._M_allocated_capacity = (size_type)(local_928 + 0x40);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_928 + 0x30),
                       "[InternalError] Invalid TypedAttribute<{}> value.","");
            tinyusdz::value::TypeTraits<std::vector<int,std::allocator<int>>>::type_name_abi_cxx11_
                      ();
            fmt::format<std::__cxx11::string>
                      ((string *)&local_610,(fmt *)(local_928 + 0x30),(string *)(local_8e8 + 0x10),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
            ::std::__cxx11::string::_M_append(local_928 + 0x10,(ulong)local_610.dynamic);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_610.dynamic != &local_600) {
              operator_delete(local_610.dynamic,local_600._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_8d8._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&local_8d8 + 0x10U)) {
              operator_delete(local_8d8._M_dataplus._M_p,
                              (ulong)(local_8d8.field_2._M_allocated_capacity + 1));
            }
            if ((vector<int,_std::allocator<int>_> *)local_8f8._M_allocated_capacity !=
                (vector<int,_std::allocator<int>_> *)(local_928 + 0x40)) {
              operator_delete((void *)local_8f8._M_allocated_capacity,(ulong)(local_8e8._0_8_ + 1));
            }
          }
          if ((local_938[0] == (fmt)0x1) && ((pointer)local_938._8_8_ != (pointer)0x0)) {
            operator_delete((void *)local_938._8_8_,local_928._8_8_ - local_938._8_8_);
          }
          if (fVar2 != (fmt)0x0) goto LAB_004f2ed9;
          bVar3 = false;
        }
        else {
LAB_004f2ed9:
          AttrMetas::operator=(&AStack_818,&(blendshape->pointIndices)._metas);
          Property::Property((Property *)&local_610,(Attribute *)&local_8b8,false);
          ::std::__cxx11::string::operator=((string *)out_prop,(string *)&local_610);
          (out_prop->_attrib)._variability = local_5f0._0_4_;
          (out_prop->_attrib)._varying_authored = local_5f0[4];
          ::std::__cxx11::string::operator=((string *)&(out_prop->_attrib)._type_name,&sStack_5e8);
          linb::any::operator=((any *)&(out_prop->_attrib)._var,&local_5c8);
          (out_prop->_attrib)._var._blocked = local_5b0;
          local_938._0_8_ =
               (out_prop->_attrib)._var._ts._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_938._8_8_ =
               *(pointer *)
                ((long)&(out_prop->_attrib)._var._ts._samples.
                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                        ._M_impl.super__Vector_impl_data + 8);
          local_928._0_8_ =
               *(pointer *)
                ((long)&(out_prop->_attrib)._var._ts._samples.
                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                        ._M_impl.super__Vector_impl_data + 0x10);
          (out_prop->_attrib)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start = local_5a8;
          *(pointer *)
           ((long)&(out_prop->_attrib)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data + 8) = local_5a0;
          *(pointer *)
           ((long)&(out_prop->_attrib)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data + 0x10) = local_598;
          local_5a8 = (pointer)0x0;
          local_5a0 = (pointer)0x0;
          local_598 = (pointer)0x0;
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)local_938);
          (out_prop->_attrib)._var._ts._dirty = local_590;
          local_938._0_8_ =
               (out_prop->_attrib)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_938._8_8_ =
               (out_prop->_attrib)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_928._0_8_ =
               (out_prop->_attrib)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          (out_prop->_attrib)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_start = local_588;
          (out_prop->_attrib)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_finish = local_580;
          (out_prop->_attrib)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_578;
          local_588 = (pointer)0x0;
          local_580 = (pointer)0x0;
          local_578 = (pointer)0x0;
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_938);
          AttrMetas::operator=(&(out_prop->_attrib)._metas,&AStack_570);
          out_prop->_listOpQual = local_368;
          out_prop->_type = TStack_364;
          (out_prop->_rel).type = local_360;
          Path::operator=(&(out_prop->_rel).targetPath,&PStack_358);
          local_938._0_8_ =
               (out_prop->_rel).targetPathVector.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_938._8_8_ =
               (out_prop->_rel).targetPathVector.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_928._0_8_ =
               (out_prop->_rel).targetPathVector.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          (out_prop->_rel).targetPathVector.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_start = local_288;
          (out_prop->_rel).targetPathVector.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_finish = local_280;
          (out_prop->_rel).targetPathVector.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_278;
          local_288 = (pointer)0x0;
          local_280 = (pointer)0x0;
          local_278 = (pointer)0x0;
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_938);
          (out_prop->_rel).listOpQual = local_270;
          AttrMetas::operator=(&(out_prop->_rel)._metas,&AStack_268);
          (out_prop->_rel)._varying_authored = local_60;
          ::std::__cxx11::string::operator=((string *)&out_prop->_prop_value_type_name,asStack_58);
          out_prop->_has_custom = local_38;
          Property::~Property((Property *)&local_610);
          bVar3 = true;
        }
        AttrMetas::~AttrMetas(&AStack_818);
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)local_850);
        if (local_860 != (undefined **)0x0) {
          (*(code *)local_860[4])(&local_870);
          local_860 = (undefined **)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_898._8_8_ != &local_880) {
          operator_delete((void *)local_898._8_8_,
                          CONCAT71(local_880._M_allocated_capacity._1_7_,local_880._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8b8._M_allocated_capacity != &local_8a8) {
          operator_delete((void *)local_8b8._M_allocated_capacity,
                          CONCAT71(local_8a8._M_allocated_capacity._1_7_,local_8a8._M_local_buf[0])
                          + 1);
        }
        if (!bVar3) {
          local_938._0_8_ = local_928;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_938,"Convert Property {} failed: {}\n","");
          fmt::format<char[13],std::__cxx11::string>
                    ((string *)&local_8b8,(fmt *)local_938,(string *)"pointIndices",
                     (char (*) [13])(local_928 + 0x10),in_R8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8b8._M_allocated_capacity == &local_8a8) {
            local_600._8_8_ = local_8a8._8_8_;
            local_610.dynamic = &local_600;
          }
          else {
            local_610.dynamic = (void *)local_8b8._M_allocated_capacity;
          }
          local_600._M_allocated_capacity._1_7_ = local_8a8._M_allocated_capacity._1_7_;
          local_600._M_local_buf[0] = local_8a8._M_local_buf[0];
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value = false;
          psVar1 = (size_type *)
                   ((long)&(__return_storage_ptr__->contained).
                           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .field_0 + 0x10);
          *(size_type **)
           &(__return_storage_ptr__->contained).
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0 = psVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_610.dynamic == &local_600) {
            *psVar1 = local_600._M_allocated_capacity;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->contained).
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0 + 0x18) = local_600._8_8_;
          }
          else {
            (__return_storage_ptr__->contained).
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_error._M_dataplus._M_p = (pointer)local_610.dynamic;
            *(size_type *)
             ((long)&(__return_storage_ptr__->contained).
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0 + 0x10) = local_600._M_allocated_capacity;
          }
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_error._M_string_length = local_8b8._8_8_;
          goto LAB_004f2dc5;
        }
      }
      else {
        cVar5 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                ::find(&(blendshape->props)._M_t,prop_name);
        if ((_Rb_tree_header *)cVar5._M_node ==
            &(blendshape->props)._M_t._M_impl.super__Rb_tree_header) {
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value = true;
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_value = false;
          goto LAB_004f31e7;
        }
        ::std::__cxx11::string::_M_assign((string *)out_prop);
        (out_prop->_attrib)._varying_authored = (bool)cVar5._M_node[3].field_0x4;
        (out_prop->_attrib)._variability = cVar5._M_node[3]._M_color;
        ::std::__cxx11::string::_M_assign((string *)&(out_prop->_attrib)._type_name);
        linb::any::operator=((any *)&(out_prop->_attrib)._var,(any *)&cVar5._M_node[4]._M_parent);
        (out_prop->_attrib)._var._blocked = SUB41(cVar5._M_node[5]._M_color,0);
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)&(out_prop->_attrib)._var._ts,
                    (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)&cVar5._M_node[5]._M_parent);
        (out_prop->_attrib)._var._ts._dirty = SUB41(cVar5._M_node[6]._M_color,0);
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (&(out_prop->_attrib)._paths,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &cVar5._M_node[6]._M_parent);
        AttrMetas::operator=(&(out_prop->_attrib)._metas,(AttrMetas *)(cVar5._M_node + 7));
        *(_Base_ptr *)&out_prop->_listOpQual = cVar5._M_node[0x17]._M_parent;
        (out_prop->_rel).type = *(Type *)&cVar5._M_node[0x17]._M_left;
        Path::operator=(&(out_prop->_rel).targetPath,(Path *)&cVar5._M_node[0x17]._M_right);
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (&(out_prop->_rel).targetPathVector,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &cVar5._M_node[0x1e]._M_parent);
        (out_prop->_rel).listOpQual = cVar5._M_node[0x1f]._M_color;
        AttrMetas::operator=(&(out_prop->_rel)._metas,(AttrMetas *)&cVar5._M_node[0x1f]._M_parent);
        (out_prop->_rel)._varying_authored = *(bool *)&cVar5._M_node[0x2f]._M_left;
        ::std::__cxx11::string::_M_assign((string *)&out_prop->_prop_value_type_name);
        out_prop->_has_custom = *(bool *)&cVar5._M_node[0x30]._M_right;
      }
    }
LAB_004f31e0:
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = true;
  }
LAB_004f31e7:
  if ((undefined1 *)local_928._16_8_ != local_928 + 0x20) {
    operator_delete((void *)local_928._16_8_,CONCAT71(local_928._33_7_,local_928[0x20]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> GetPrimProperty(
    const BlendShape &blendshape, const std::string &prop_name,
    Property *out_prop) {
  if (!out_prop) {
    return nonstd::make_unexpected(
        "[InternalError] nullptr in output Property is not allowed.");
  }

  DCOUT("prop_name = " << prop_name);
  std::string err;

  TO_PROPERTY("offsets", blendshape.offsets)
  TO_PROPERTY("normalOffsets", blendshape.normalOffsets)
  TO_PROPERTY("pointIndices", blendshape.pointIndices)

  {
    const auto it = blendshape.props.find(prop_name);
    if (it == blendshape.props.end()) {
      // Attribute not found.
      return false;
    }

    (*out_prop) = it->second;
  }
  DCOUT("Prop found: " << prop_name
                       << ", ty = " << out_prop->value_type_name());
  return true;
}